

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_state.c
# Opt level: O0

void setup_simple_state_c(kcc_kinematic_chain *kc,solver_state_c *s)

{
  int iVar1;
  int iVar2;
  gc_pose *pgVar3;
  gc_twist *pgVar4;
  gc_acc_twist *pgVar5;
  mc_abi *pmVar6;
  mc_momentum *pmVar7;
  mc_wrench *pmVar8;
  joint_torque *pjVar9;
  joint_position *pjVar10;
  joint_velocity *pjVar11;
  joint_acceleration *pjVar12;
  matrix3x3 *pmVar13;
  vector3 *pvVar14;
  int local_2c;
  int local_28;
  int i_1;
  int i;
  int EE;
  int NR_SEGMENTS_WITH_BASE;
  int NR_SEGMENTS;
  solver_state_c *s_local;
  kcc_kinematic_chain *kc_local;
  
  iVar1 = kc->number_of_segments;
  iVar2 = iVar1 + 1;
  s->nbody = iVar1;
  s->nq = iVar1;
  s->nd = iVar1;
  pgVar3 = (gc_pose *)calloc((long)iVar1,0x10);
  s->x_jnt = pgVar3;
  pgVar3 = (gc_pose *)calloc((long)iVar1,0x10);
  s->x_rel = pgVar3;
  pgVar3 = (gc_pose *)calloc((long)iVar2,0x10);
  s->x_tot = pgVar3;
  pgVar4 = (gc_twist *)calloc((long)iVar1,0x10);
  s->xd_jnt = pgVar4;
  pgVar4 = (gc_twist *)calloc((long)iVar1,0x10);
  s->xd_tf = pgVar4;
  pgVar4 = (gc_twist *)calloc((long)iVar2,0x10);
  s->xd = pgVar4;
  pgVar5 = (gc_acc_twist *)calloc((long)iVar1,0x10);
  s->xdd_jnt = pgVar5;
  pgVar5 = (gc_acc_twist *)calloc((long)iVar1,0x10);
  s->xdd_net = pgVar5;
  pgVar5 = (gc_acc_twist *)calloc((long)iVar1,0x10);
  s->xdd_bias = pgVar5;
  pgVar5 = (gc_acc_twist *)calloc((long)iVar2,0x10);
  s->xdd_tf = pgVar5;
  pgVar5 = (gc_acc_twist *)calloc((long)iVar1,0x10);
  s->xdd_nact = pgVar5;
  pgVar5 = (gc_acc_twist *)calloc((long)iVar2,0x10);
  s->xdd = pgVar5;
  pmVar6 = (mc_abi *)calloc((long)iVar2,0xd8);
  s->m_art = pmVar6;
  pmVar6 = (mc_abi *)calloc((long)iVar1,0xd8);
  s->m_app = pmVar6;
  pmVar6 = (mc_abi *)calloc((long)iVar2,0xd8);
  s->m_tf = pmVar6;
  pmVar7 = (mc_momentum *)calloc((long)iVar1,0x10);
  s->p = pmVar7;
  pmVar8 = (mc_wrench *)calloc((long)iVar2,0x10);
  s->f_bias_art = pmVar8;
  pmVar8 = (mc_wrench *)calloc((long)iVar1,0x10);
  s->f_bias_eom = pmVar8;
  pmVar8 = (mc_wrench *)calloc((long)iVar1,0x10);
  s->f_bias_app = pmVar8;
  pmVar8 = (mc_wrench *)calloc((long)iVar1,0x10);
  s->f_bias_tf = pmVar8;
  pmVar8 = (mc_wrench *)calloc((long)iVar1,0x10);
  s->f_bias_nact = pmVar8;
  pjVar9 = (joint_torque *)calloc((long)s->nd,8);
  s->tau_bias_art = pjVar9;
  pmVar8 = (mc_wrench *)calloc((long)iVar2,0x10);
  s->f_ff_art = pmVar8;
  pmVar8 = (mc_wrench *)calloc((long)iVar1,0x10);
  s->f_ff_app = pmVar8;
  pmVar8 = (mc_wrench *)calloc((long)iVar1,0x10);
  s->f_ff_jnt = pmVar8;
  pjVar9 = (joint_torque *)calloc((long)s->nd,8);
  s->tau_ff_art = pjVar9;
  pjVar9 = (joint_torque *)calloc((long)s->nd,8);
  s->tau_ff = pjVar9;
  pmVar8 = (mc_wrench *)calloc((long)iVar1,0x10);
  s->f_ext = pmVar8;
  pmVar8 = (mc_wrench *)calloc((long)iVar2,0x10);
  s->f_ext_art = pmVar8;
  pmVar8 = (mc_wrench *)calloc((long)iVar1,0x10);
  s->f_ext_app = pmVar8;
  pmVar8 = (mc_wrench *)calloc((long)iVar1,0x10);
  s->f_ext_tf = pmVar8;
  pjVar9 = (joint_torque *)calloc((long)s->nd,8);
  s->tau_ext_art = pjVar9;
  pjVar10 = (joint_position *)calloc((long)s->nq,8);
  s->q = pjVar10;
  pjVar11 = (joint_velocity *)calloc((long)s->nd,8);
  s->qd = pjVar11;
  pjVar12 = (joint_acceleration *)calloc((long)s->nd,8);
  s->qdd = pjVar12;
  pjVar9 = (joint_torque *)calloc((long)s->nd,8);
  s->tau_ctrl = pjVar9;
  for (local_28 = 0; local_28 < iVar1; local_28 = local_28 + 1) {
    pmVar13 = (matrix3x3 *)calloc(1,0x48);
    s->x_jnt[local_28].rotation = pmVar13;
    pvVar14 = (vector3 *)calloc(1,0x18);
    s->x_jnt[local_28].translation = pvVar14;
    pmVar13 = (matrix3x3 *)calloc(1,0x48);
    s->x_rel[local_28].rotation = pmVar13;
    pvVar14 = (vector3 *)calloc(1,0x18);
    s->x_rel[local_28].translation = pvVar14;
    pvVar14 = (vector3 *)calloc(1,0x18);
    s->xd_jnt[local_28].angular_velocity = pvVar14;
    pvVar14 = (vector3 *)calloc(1,0x18);
    s->xd_jnt[local_28].linear_velocity = pvVar14;
    pvVar14 = (vector3 *)calloc(1,0x18);
    s->xd_tf[local_28].angular_velocity = pvVar14;
    pvVar14 = (vector3 *)calloc(1,0x18);
    s->xd_tf[local_28].linear_velocity = pvVar14;
    pvVar14 = (vector3 *)calloc(1,0x18);
    s->xdd_jnt[local_28].angular_acceleration = pvVar14;
    pvVar14 = (vector3 *)calloc(1,0x18);
    s->xdd_jnt[local_28].linear_acceleration = pvVar14;
    pvVar14 = (vector3 *)calloc(1,0x18);
    s->xdd_bias[local_28].angular_acceleration = pvVar14;
    pvVar14 = (vector3 *)calloc(1,0x18);
    s->xdd_bias[local_28].linear_acceleration = pvVar14;
    pvVar14 = (vector3 *)calloc(1,0x18);
    s->xdd_net[local_28].angular_acceleration = pvVar14;
    pvVar14 = (vector3 *)calloc(1,0x18);
    s->xdd_net[local_28].linear_acceleration = pvVar14;
    pvVar14 = (vector3 *)calloc(1,0x18);
    s->xdd_nact[local_28].angular_acceleration = pvVar14;
    pvVar14 = (vector3 *)calloc(1,0x18);
    s->xdd_nact[local_28].linear_acceleration = pvVar14;
    pvVar14 = (vector3 *)calloc(1,0x18);
    s->p[local_28].angular_momentum = pvVar14;
    pvVar14 = (vector3 *)calloc(1,0x18);
    s->p[local_28].linear_momentum = pvVar14;
    pvVar14 = (vector3 *)calloc(1,0x18);
    s->f_bias_eom[local_28].torque = pvVar14;
    pvVar14 = (vector3 *)calloc(1,0x18);
    s->f_bias_eom[local_28].force = pvVar14;
    pvVar14 = (vector3 *)calloc(1,0x18);
    s->f_bias_app[local_28].torque = pvVar14;
    pvVar14 = (vector3 *)calloc(1,0x18);
    s->f_bias_app[local_28].force = pvVar14;
    pvVar14 = (vector3 *)calloc(1,0x18);
    s->f_bias_tf[local_28].torque = pvVar14;
    pvVar14 = (vector3 *)calloc(1,0x18);
    s->f_bias_tf[local_28].force = pvVar14;
    pvVar14 = (vector3 *)calloc(1,0x18);
    s->f_bias_nact[local_28].torque = pvVar14;
    pvVar14 = (vector3 *)calloc(1,0x18);
    s->f_bias_nact[local_28].force = pvVar14;
    pvVar14 = (vector3 *)calloc(1,0x18);
    s->f_ff_app[local_28].torque = pvVar14;
    pvVar14 = (vector3 *)calloc(1,0x18);
    s->f_ff_app[local_28].force = pvVar14;
    pvVar14 = (vector3 *)calloc(1,0x18);
    s->f_ff_jnt[local_28].torque = pvVar14;
    pvVar14 = (vector3 *)calloc(1,0x18);
    s->f_ff_jnt[local_28].force = pvVar14;
    pvVar14 = (vector3 *)calloc(1,0x18);
    s->f_ext[local_28].torque = pvVar14;
    pvVar14 = (vector3 *)calloc(1,0x18);
    s->f_ext[local_28].force = pvVar14;
    pvVar14 = (vector3 *)calloc(1,0x18);
    s->f_ext_app[local_28].torque = pvVar14;
    pvVar14 = (vector3 *)calloc(1,0x18);
    s->f_ext_app[local_28].force = pvVar14;
    pvVar14 = (vector3 *)calloc(1,0x18);
    s->f_ext_tf[local_28].torque = pvVar14;
    pvVar14 = (vector3 *)calloc(1,0x18);
    s->f_ext_tf[local_28].force = pvVar14;
  }
  for (local_2c = 0; local_2c < iVar2; local_2c = local_2c + 1) {
    pmVar13 = (matrix3x3 *)calloc(1,0x48);
    s->x_tot[local_2c].rotation = pmVar13;
    pvVar14 = (vector3 *)calloc(1,0x18);
    s->x_tot[local_2c].translation = pvVar14;
    pvVar14 = (vector3 *)calloc(1,0x18);
    s->xd[local_2c].angular_velocity = pvVar14;
    pvVar14 = (vector3 *)calloc(1,0x18);
    s->xd[local_2c].linear_velocity = pvVar14;
    pvVar14 = (vector3 *)calloc(1,0x18);
    s->xdd[local_2c].angular_acceleration = pvVar14;
    pvVar14 = (vector3 *)calloc(1,0x18);
    s->xdd[local_2c].linear_acceleration = pvVar14;
    pvVar14 = (vector3 *)calloc(1,0x18);
    s->xdd_tf[local_2c].angular_acceleration = pvVar14;
    pvVar14 = (vector3 *)calloc(1,0x18);
    s->xdd_tf[local_2c].linear_acceleration = pvVar14;
    pvVar14 = (vector3 *)calloc(1,0x18);
    s->f_bias_art[local_2c].torque = pvVar14;
    pvVar14 = (vector3 *)calloc(1,0x18);
    s->f_bias_art[local_2c].force = pvVar14;
    pvVar14 = (vector3 *)calloc(1,0x18);
    s->f_ff_art[local_2c].torque = pvVar14;
    pvVar14 = (vector3 *)calloc(1,0x18);
    s->f_ff_art[local_2c].force = pvVar14;
    pvVar14 = (vector3 *)calloc(1,0x18);
    s->f_ext_art[local_2c].torque = pvVar14;
    pvVar14 = (vector3 *)calloc(1,0x18);
    s->f_ext_art[local_2c].force = pvVar14;
  }
  *(undefined8 *)&s->x_tot->rotation->field_0 = 0x3ff0000000000000;
  *(undefined8 *)((long)&s->x_tot->rotation->field_0 + 0x20) = 0x3ff0000000000000;
  *(undefined8 *)((long)&s->x_tot->rotation->field_0 + 0x40) = 0x3ff0000000000000;
  return;
}

Assistant:

void setup_simple_state_c(
        const struct kcc_kinematic_chain *kc,
        struct solver_state_c *s)
{
    const int NR_SEGMENTS = kc->number_of_segments;
    const int NR_SEGMENTS_WITH_BASE = NR_SEGMENTS + 1;
    const int EE = NR_SEGMENTS;

    // FPK
    s->nbody = NR_SEGMENTS;
    s->nq = NR_SEGMENTS;
    // FVK
    s->nd = NR_SEGMENTS;

    // FPK
    s->x_jnt = calloc(NR_SEGMENTS, sizeof(struct gc_pose));
    s->x_rel = calloc(NR_SEGMENTS, sizeof(struct gc_pose));
    s->x_tot = calloc(NR_SEGMENTS_WITH_BASE, sizeof(struct gc_pose));
    // FVK
    s->xd_jnt = calloc(NR_SEGMENTS, sizeof(struct gc_twist));
    s->xd_tf  = calloc(NR_SEGMENTS, sizeof(struct gc_twist));
    s->xd     = calloc(NR_SEGMENTS_WITH_BASE, sizeof(struct gc_twist));
    // FAK
    s->xdd_jnt   = calloc(NR_SEGMENTS, sizeof(struct gc_acc_twist));
    s->xdd_net   = calloc(NR_SEGMENTS, sizeof(struct gc_acc_twist));
    s->xdd_bias  = calloc(NR_SEGMENTS, sizeof(struct gc_acc_twist));
    s->xdd_tf    = calloc(NR_SEGMENTS_WITH_BASE, sizeof(struct gc_acc_twist));
    s->xdd_nact  = calloc(NR_SEGMENTS, sizeof(struct gc_acc_twist));
    s->xdd       = calloc(NR_SEGMENTS_WITH_BASE, sizeof(struct gc_acc_twist));
    // Inertia
    s->m_art = calloc(NR_SEGMENTS_WITH_BASE, sizeof(struct mc_abi));
    s->m_app = calloc(NR_SEGMENTS, sizeof(struct mc_abi));
    s->m_tf  = calloc(NR_SEGMENTS_WITH_BASE, sizeof(struct mc_abi));
    // Inertial force
    s->p            = calloc(NR_SEGMENTS, sizeof(struct mc_momentum));
    s->f_bias_art   = calloc(NR_SEGMENTS_WITH_BASE, sizeof(struct mc_wrench));
    s->f_bias_eom   = calloc(NR_SEGMENTS, sizeof(struct mc_wrench));
    s->f_bias_app   = calloc(NR_SEGMENTS, sizeof(struct mc_wrench));
    s->f_bias_tf    = calloc(NR_SEGMENTS, sizeof(struct mc_wrench));
    s->f_bias_nact  = calloc(NR_SEGMENTS, sizeof(struct mc_wrench));
    s->tau_bias_art = calloc(s->nd, sizeof(joint_torque));
    // Feed-forward torque
    s->f_ff_art   = calloc(NR_SEGMENTS_WITH_BASE, sizeof(struct mc_wrench));
    s->f_ff_app   = calloc(NR_SEGMENTS, sizeof(struct mc_wrench));
    s->f_ff_jnt   = calloc(NR_SEGMENTS, sizeof(struct mc_wrench));
    s->tau_ff_art = calloc(s->nd, sizeof(joint_torque));
    // External force
    s->tau_ff      = calloc(s->nd, sizeof(joint_torque));
    s->f_ext       = calloc(NR_SEGMENTS, sizeof(struct mc_wrench));
    s->f_ext_art   = calloc(NR_SEGMENTS_WITH_BASE, sizeof(struct mc_wrench));
    s->f_ext_app   = calloc(NR_SEGMENTS, sizeof(struct mc_wrench));
    s->f_ext_tf    = calloc(NR_SEGMENTS, sizeof(struct mc_wrench));
    s->tau_ext_art = calloc(s->nd, sizeof(joint_torque));

    // FPK
    s->q     = calloc(s->nq, sizeof(double));
    // FVK
    s->qd    = calloc(s->nd, sizeof(double));
    // FAK
    s->qdd   = calloc(s->nd, sizeof(double));
    // Dynamics
    s->tau_ctrl = calloc(s->nd, sizeof(joint_torque));

    for (int i = 0; i < NR_SEGMENTS; i++) {
        // FPK
        s->x_jnt[i].rotation    = calloc(1, sizeof(struct matrix3x3));
        s->x_jnt[i].translation = calloc(1, sizeof(struct vector3));
        s->x_rel[i].rotation    = calloc(1, sizeof(struct matrix3x3));
        s->x_rel[i].translation = calloc(1, sizeof(struct vector3));
        // FVK
        s->xd_jnt[i].angular_velocity = calloc(1, sizeof(struct vector3));
        s->xd_jnt[i].linear_velocity  = calloc(1, sizeof(struct vector3));
        s->xd_tf[i].angular_velocity  = calloc(1, sizeof(struct vector3));
        s->xd_tf[i].linear_velocity   = calloc(1, sizeof(struct vector3));
        // FAK
        s->xdd_jnt[i].angular_acceleration  = calloc(1, sizeof(struct vector3));
        s->xdd_jnt[i].linear_acceleration   = calloc(1, sizeof(struct vector3));
        s->xdd_bias[i].angular_acceleration = calloc(1, sizeof(struct vector3));
        s->xdd_bias[i].linear_acceleration  = calloc(1, sizeof(struct vector3));
        s->xdd_net[i].angular_acceleration  = calloc(1, sizeof(struct vector3));
        s->xdd_net[i].linear_acceleration   = calloc(1, sizeof(struct vector3));
        s->xdd_nact[i].angular_acceleration = calloc(1, sizeof(struct vector3));
        s->xdd_nact[i].linear_acceleration  = calloc(1, sizeof(struct vector3));
        // Inertial force
        s->p[i].angular_momentum = calloc(1, sizeof(struct vector3));
        s->p[i].linear_momentum  = calloc(1, sizeof(struct vector3));
        s->f_bias_eom[i].torque  = calloc(1, sizeof(struct vector3));
        s->f_bias_eom[i].force   = calloc(1, sizeof(struct vector3));
        s->f_bias_app[i].torque  = calloc(1, sizeof(struct vector3));
        s->f_bias_app[i].force   = calloc(1, sizeof(struct vector3));
        s->f_bias_tf[i].torque   = calloc(1, sizeof(struct vector3));
        s->f_bias_tf[i].force    = calloc(1, sizeof(struct vector3));
        s->f_bias_nact[i].torque = calloc(1, sizeof(struct vector3));
        s->f_bias_nact[i].force  = calloc(1, sizeof(struct vector3));
        // Feed-forward torque
        s->f_ff_app[i].torque = calloc(1, sizeof(struct vector3));
        s->f_ff_app[i].force  = calloc(1, sizeof(struct vector3));
        s->f_ff_jnt[i].torque = calloc(1, sizeof(struct vector3));
        s->f_ff_jnt[i].force  = calloc(1, sizeof(struct vector3));
        // External force
        s->f_ext[i].torque     = calloc(1, sizeof(struct vector3));
        s->f_ext[i].force      = calloc(1, sizeof(struct vector3));
        s->f_ext_app[i].torque = calloc(1, sizeof(struct vector3));
        s->f_ext_app[i].force  = calloc(1, sizeof(struct vector3));
        s->f_ext_tf[i].torque  = calloc(1, sizeof(struct vector3));
        s->f_ext_tf[i].force   = calloc(1, sizeof(struct vector3));
    }

    for (int i = 0; i < NR_SEGMENTS_WITH_BASE; i++) {
        // FPK
        s->x_tot[i].rotation    = calloc(1, sizeof(struct matrix3x3));
        s->x_tot[i].translation = calloc(1, sizeof(struct vector3));
        // FVK
        s->xd[i].angular_velocity        = calloc(1, sizeof(struct vector3));
        s->xd[i].linear_velocity         = calloc(1, sizeof(struct vector3));
        // FAK
        s->xdd[i].angular_acceleration    = calloc(1, sizeof(struct vector3));
        s->xdd[i].linear_acceleration     = calloc(1, sizeof(struct vector3));
        s->xdd_tf[i].angular_acceleration = calloc(1, sizeof(struct vector3));
        s->xdd_tf[i].linear_acceleration  = calloc(1, sizeof(struct vector3));
        // Inertial force
        s->f_bias_art[i].torque = calloc(1, sizeof(struct vector3));
        s->f_bias_art[i].force  = calloc(1, sizeof(struct vector3));
        // Feed-forward torque
        s->f_ff_art[i].torque = calloc(1, sizeof(struct vector3));
        s->f_ff_art[i].force  = calloc(1, sizeof(struct vector3));
        // External force
        s->f_ext_art[i].torque = calloc(1, sizeof(struct vector3));
        s->f_ext_art[i].force  = calloc(1, sizeof(struct vector3));
    }

    // FPK
    s->x_tot[0].rotation->row_x.x = 1.0;
    s->x_tot[0].rotation->row_y.y = 1.0;
    s->x_tot[0].rotation->row_z.z = 1.0;
}